

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O3

void __thiscall
Potassco::ProgramOptions::anon_unknown_15::CommandLineParser::doParse(CommandLineParser *this)

{
  pointer *pppcVar1;
  Option *pOVar2;
  byte bVar3;
  ParseContext *pPVar4;
  iterator iVar5;
  bool bVar6;
  IntrusiveSharedPtr<Potassco::ProgramOptions::Option> IVar7;
  undefined8 uVar8;
  vector<char_const*,std::allocator<char_const*>> *this_00;
  char cVar9;
  int iVar10;
  undefined4 extraout_var;
  ulong uVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar12;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  SyntaxError *pSVar13;
  ulong uVar14;
  Option *temp;
  char *pcVar15;
  SharedOptPtr o;
  SharedOptPtr on;
  string name;
  string value;
  IntrusiveSharedPtr<Potassco::ProgramOptions::Option> local_98;
  char *local_90;
  IntrusiveSharedPtr<Potassco::ProgramOptions::Option> local_88;
  undefined1 local_80 [32];
  IntrusiveSharedPtr<Potassco::ProgramOptions::Option> local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 local_48 [16];
  vector<char_const*,std::allocator<char_const*>> *local_38;
  
  iVar10 = (*(this->super_OptionParser)._vptr_OptionParser[3])();
  pcVar15 = (char *)CONCAT44(extraout_var,iVar10);
  if (pcVar15 != (char *)0x0) {
    local_38 = (vector<char_const*,std::allocator<char_const*>> *)&this->remaining;
    uVar14 = 0;
    do {
      local_90 = pcVar15;
      if ((*pcVar15 == '-') && (pcVar15[1] != '\0')) {
        if (pcVar15[1] != '-') {
          local_98.ptr_._0_2_ = (ushort)(byte)local_98.ptr_._0_1_;
          local_58._M_allocated_capacity = 0;
          cVar9 = pcVar15[1];
          bVar6 = true;
          if (cVar9 != '\0') {
            pcVar15 = pcVar15 + 2;
            do {
              local_98.ptr_._0_1_ = (allocator)cVar9;
              pPVar4 = (this->super_OptionParser).ctx_;
              (*pPVar4->_vptr_ParseContext[2])(local_80,pPVar4,&local_98,4);
              if ((Option *)local_80._0_8_ != (Option *)0x0) {
                *(int *)local_80._0_8_ = *(int *)local_80._0_8_ + 1;
              }
              detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::release
                        ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)
                         &local_58._M_allocated_capacity);
              uVar8 = local_80._0_8_;
              local_58._M_allocated_capacity = local_80._0_8_;
              detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::release
                        ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)local_80);
              bVar6 = (Option *)uVar8 != (Option *)0x0;
              if ((Option *)uVar8 == (Option *)0x0) break;
              bVar3 = *(byte *)(*(long *)(local_58._M_allocated_capacity + 0x30) + 9);
              pOVar2 = (Option *)(local_80 + 0x10);
              if ((bVar3 & 1) == 0) {
                if (*pcVar15 == '\0') {
                  iVar10 = (*(this->super_OptionParser)._vptr_OptionParser[3])(this);
                  pcVar15 = (char *)CONCAT44(extraout_var_01,iVar10);
                  if (pcVar15 == (char *)0x0) {
                    pSVar13 = (SyntaxError *)__cxa_allocate_exception(0x38);
                    local_80._0_8_ = pOVar2;
                    sVar12 = strlen((char *)&local_98);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_80,&local_98,(long)&local_98.ptr_ + sVar12);
                    SyntaxError::SyntaxError(pSVar13,missing_value,(string *)local_80);
                    __cxa_throw(pSVar13,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
                  }
                }
                local_80._0_8_ = pOVar2;
                sVar12 = strlen(pcVar15);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_80,pcVar15,pcVar15 + sVar12);
                pPVar4 = (this->super_OptionParser).ctx_;
                (*pPVar4->_vptr_ParseContext[4])(pPVar4,&local_58,(string *)local_80);
LAB_0011538c:
                if ((Option *)local_80._0_8_ != pOVar2) {
                  operator_delete((void *)local_80._0_8_);
                }
                bVar6 = true;
                break;
              }
              if ((~bVar3 & 3) != 0) {
                local_80._0_8_ = pOVar2;
                sVar12 = strlen(pcVar15);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_80,pcVar15,pcVar15 + sVar12);
                pPVar4 = (this->super_OptionParser).ctx_;
                (*pPVar4->_vptr_ParseContext[4])(pPVar4,&local_58,(string *)local_80);
                goto LAB_0011538c;
              }
              local_80._8_8_ = 0;
              local_80[0x10] = '\0';
              pPVar4 = (this->super_OptionParser).ctx_;
              local_80._0_8_ = pOVar2;
              (*pPVar4->_vptr_ParseContext[4])(pPVar4,&local_58,local_80);
              if ((Option *)local_80._0_8_ != pOVar2) {
                operator_delete((void *)local_80._0_8_);
              }
              cVar9 = *pcVar15;
              pcVar15 = pcVar15 + 1;
            } while (cVar9 != '\0');
          }
          detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::release
                    ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)
                     &local_58._M_allocated_capacity);
joined_r0x001153a9:
          if (!bVar6) goto LAB_00115121;
          local_90 = (char *)0x0;
          goto LAB_001153b8;
        }
        if (pcVar15[2] != '\0') {
          std::__cxx11::string::string
                    ((string *)local_80,pcVar15 + 2,(allocator *)local_58._M_local_buf);
          local_58._M_allocated_capacity = (size_type)local_48;
          local_58._8_8_ = (char *)0x0;
          local_48[0] = 0;
          uVar11 = std::__cxx11::string::find((char)(string *)local_80,0x3d);
          if (uVar11 != 0xffffffffffffffff) {
            std::__cxx11::string::assign((string *)local_58._M_local_buf,(ulong)local_80,uVar11 + 1)
            ;
            if ((ulong)local_80._8_8_ < uVar11) {
              std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase",uVar11);
              goto LAB_001154ba;
            }
            *(char *)(local_80._0_8_ + uVar11) = '\0';
            local_80._8_8_ = uVar11;
          }
          local_98.ptr_ = (Option *)0x0;
          local_88.ptr_ = (Option *)0x0;
          if (((((char *)local_58._8_8_ == (char *)0x0) && (pcVar15[2] == 'n')) &&
              (pcVar15[3] == 'o')) && (pcVar15[4] == '-')) {
            pPVar4 = (this->super_OptionParser).ctx_;
            (*pPVar4->_vptr_ParseContext[2])(&local_60,pPVar4,pcVar15 + 5,3);
            if (local_60.ptr_ != (Option *)0x0) {
              ((local_60.ptr_)->super_RefCountable).refCount_ =
                   ((local_60.ptr_)->super_RefCountable).refCount_ + 1;
            }
            detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::release(&local_88);
            local_88.ptr_ = local_60.ptr_;
            detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::release(&local_60);
            if ((local_88.ptr_ != (Option *)0x0) && (((local_88.ptr_)->value_->flags_ & 8) == 0)) {
              detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::release(&local_88);
              local_88.ptr_ = (Option *)0x0;
            }
          }
          pPVar4 = (this->super_OptionParser).ctx_;
          (*pPVar4->_vptr_ParseContext[2])(&local_60,pPVar4,local_80._0_8_,3);
          if (local_60.ptr_ != (Option *)0x0) {
            ((local_60.ptr_)->super_RefCountable).refCount_ =
                 ((local_60.ptr_)->super_RefCountable).refCount_ + 1;
          }
          detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::release(&local_98);
          local_98.ptr_ = local_60.ptr_;
          detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::release(&local_60);
          IVar7.ptr_ = local_98.ptr_;
          if (local_98.ptr_ == (Option *)0x0) {
            if (local_88.ptr_ != (Option *)0x0) {
              local_98.ptr_ = local_88.ptr_;
              local_88.ptr_ = (Option *)0x0;
              std::__cxx11::string::_M_replace((ulong)&local_58,0,(char *)local_58._8_8_,0x11e2bf);
              if (local_98.ptr_ != (Option *)0x0) goto LAB_00115057;
            }
            bVar6 = false;
          }
          else {
LAB_00115057:
            bVar3 = (local_98.ptr_)->value_->flags_;
            if ((char *)local_58._8_8_ == (char *)0x0 && (bVar3 & 1) == 0) {
              iVar10 = (*(this->super_OptionParser)._vptr_OptionParser[3])(this);
              uVar8 = local_58._8_8_;
              pcVar15 = (char *)CONCAT44(extraout_var_00,iVar10);
              if (pcVar15 == (char *)0x0) {
LAB_001154ba:
                pSVar13 = (SyntaxError *)__cxa_allocate_exception(0x38);
                SyntaxError::SyntaxError(pSVar13,missing_value,(string *)local_80);
                __cxa_throw(pSVar13,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
              }
              strlen(pcVar15);
              std::__cxx11::string::_M_replace((ulong)&local_58,0,(char *)uVar8,(ulong)pcVar15);
            }
            else if ((((~bVar3 & 3) == 0) && (IVar7.ptr_ != (Option *)0x0)) &&
                    (((char *)local_58._8_8_ != (char *)0x0 && ((this->flags & 1) == 0)))) {
              pSVar13 = (SyntaxError *)__cxa_allocate_exception(0x38);
              SyntaxError::SyntaxError(pSVar13,extra_value,(string *)local_80);
              __cxa_throw(pSVar13,&SyntaxError::typeinfo,SyntaxError::~SyntaxError);
            }
            pPVar4 = (this->super_OptionParser).ctx_;
            bVar6 = true;
            (*pPVar4->_vptr_ParseContext[4])(pPVar4,&local_98,&local_58);
          }
          detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::release(&local_88);
          detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::release(&local_98);
          if ((undefined1 *)local_58._M_allocated_capacity != local_48) {
            operator_delete((void *)local_58._M_allocated_capacity);
          }
          if ((Option *)local_80._0_8_ != (Option *)(local_80 + 0x10)) {
            operator_delete((void *)local_80._0_8_);
          }
          goto joined_r0x001153a9;
        }
        local_90 = (char *)0x0;
        bVar6 = true;
      }
      else {
        pPVar4 = (this->super_OptionParser).ctx_;
        (*pPVar4->_vptr_ParseContext[3])(&local_58,pPVar4,uVar14,pcVar15);
        if ((int *)local_58._M_allocated_capacity != (int *)0x0) {
          std::__cxx11::string::string((string *)local_80,local_90,(allocator *)&local_98);
          pPVar4 = (this->super_OptionParser).ctx_;
          (*pPVar4->_vptr_ParseContext[4])(pPVar4,&local_58,(string *)local_80);
          if ((Option *)local_80._0_8_ != (Option *)(local_80 + 0x10)) {
            operator_delete((void *)local_80._0_8_);
          }
          local_90 = (char *)0x0;
        }
        detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>::release
                  ((IntrusiveSharedPtr<Potassco::ProgramOptions::Option> *)
                   &local_58._M_allocated_capacity);
        uVar14 = (ulong)((int)uVar14 + 1);
LAB_00115121:
        if (local_90 != (char *)0x0) {
          iVar5._M_current =
               (this->remaining).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->remaining).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<char_const*,std::allocator<char_const*>>::
            _M_realloc_insert<char_const*const&>(local_38,iVar5,&local_90);
          }
          else {
            *iVar5._M_current = local_90;
            pppcVar1 = &(this->remaining).
                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppcVar1 = *pppcVar1 + 1;
          }
        }
LAB_001153b8:
        bVar6 = false;
      }
      iVar10 = (*(this->super_OptionParser)._vptr_OptionParser[3])(this);
      this_00 = local_38;
      pcVar15 = (char *)CONCAT44(extraout_var_02,iVar10);
    } while ((pcVar15 != (char *)0x0) && (!bVar6));
    if (pcVar15 != (char *)0x0) {
      do {
        iVar5._M_current =
             (this->remaining).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_90 = pcVar15;
        if (iVar5._M_current ==
            (this->remaining).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                    (this_00,iVar5,&local_90);
        }
        else {
          *iVar5._M_current = pcVar15;
          pppcVar1 = &(this->remaining).
                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppcVar1 = *pppcVar1 + 1;
        }
        iVar10 = (*(this->super_OptionParser)._vptr_OptionParser[3])(this);
        pcVar15 = (char *)CONCAT44(extraout_var_03,iVar10);
      } while (pcVar15 != (char *)0x0);
    }
  }
  return;
}

Assistant:

void doParse() {
		bool breakEarly = false;
		int  posKey = 0;
		const char* curr;
		while ((curr = next()) != 0 && !breakEarly) {
			switch (getOptionType(curr)) {
				case short_opt: if (handleShortOpt(curr + 1)) curr = 0; break;
				case long_opt:  if (handleLongOpt(curr + 2))  curr = 0; break;
				case end_opt:   curr = 0; breakEarly = true; break;
				case no_opt: {
					SharedOptPtr opt = getOption(posKey++, curr);
					if (opt.get()) {
						addOptionValue(opt, curr);
						curr = 0;
					}
					break; }
				default:
					assert(0);
			}
			if (curr) {
				remaining.push_back(curr);
			}
		}
		while (curr) {
			remaining.push_back(curr);
			curr = next();
		}
	}